

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

void __thiscall IR::Instr::Unlink(Instr *this)

{
  Instr *this_00;
  code *pcVar1;
  bool bVar2;
  IRKind IVar3;
  undefined4 *puVar4;
  bool local_21;
  Instr *this_local;
  
  this->m_prev->m_next = this->m_next;
  if (this->m_next == (Instr *)0x0) {
    if (this != this->m_func->m_tailInstr) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0x19b,"(this == this->m_func->m_tailInstr)",
                         "this == this->m_func->m_tailInstr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
  }
  else {
    this->m_next->m_prev = this->m_prev;
  }
  if (((this->globOptInstrString != (char16 *)0x0) && (this->m_next != (Instr *)0x0)) &&
     (this->m_next->globOptInstrString == (char16 *)0x0)) {
    this_00 = this->m_next;
    IVar3 = GetKind(this_00);
    local_21 = true;
    if (IVar3 != InstrKindLabel) {
      local_21 = IsProfiledLabelInstr(this_00);
    }
    if (local_21 == false) {
      this->m_next->globOptInstrString = this->globOptInstrString;
    }
  }
  this->m_prev = (Instr *)0x0;
  this->m_next = (Instr *)0x0;
  return;
}

Assistant:

void
Instr::Unlink()
{
    m_prev->m_next = m_next;
    if (m_next)
    {
        m_next->m_prev = m_prev;
    }
    else
    {
        Assert(this == this->m_func->m_tailInstr);
    }

#if DBG_DUMP
    // Transferring the globOptInstrString to the next non-Label Instruction
    if(this->globOptInstrString != nullptr && m_next && m_next->globOptInstrString == nullptr && !m_next->IsLabelInstr())
    {
        m_next->globOptInstrString = this->globOptInstrString;
    }
#endif

#if DBG
    m_prev = nullptr;
    m_next = nullptr;
#endif
}